

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::perturbMaxLeave(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p_delta_00;
  undefined1 in_stack_fffffffffffffd48 [96];
  Status *in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffdb8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffd50,this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->thePvec->thedelta);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup(&this->theCoPvec->thedelta);
  pVVar1 = this->theLbound;
  pUVar2 = this->thePvec;
  pVVar3 = this->theUbound;
  epsilon(&local_b0,this);
  leavetol(&local_1b0,this);
  p_delta.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.stat)->data;
  p_delta.m_backend.data._M_elems._0_8_ = &local_1b0;
  p_delta.m_backend.data._M_elems[4] = 0;
  p_delta.m_backend.data._M_elems[5] = 0;
  p_delta.m_backend.data._M_elems[6] = 1;
  p_delta.m_backend.data._M_elems[7] = 0;
  p_delta.m_backend.data._M_elems[8] = in_stack_fffffffffffffd48._0_4_;
  p_delta.m_backend.data._M_elems[9] = in_stack_fffffffffffffd48._4_4_;
  p_delta.m_backend.data._M_elems[10] = in_stack_fffffffffffffd48._8_4_;
  p_delta.m_backend.data._M_elems[0xb] = in_stack_fffffffffffffd48._12_4_;
  p_delta.m_backend.data._M_elems[0xc] = in_stack_fffffffffffffd48._16_4_;
  p_delta.m_backend.data._M_elems[0xd] = in_stack_fffffffffffffd48._20_4_;
  p_delta.m_backend.data._M_elems[0xe] = in_stack_fffffffffffffd48._24_4_;
  p_delta.m_backend.data._M_elems[0xf] = in_stack_fffffffffffffd48._28_4_;
  p_delta.m_backend.data._M_elems[0x10] = in_stack_fffffffffffffd48._32_4_;
  p_delta.m_backend.data._M_elems[0x11] = in_stack_fffffffffffffd48._36_4_;
  p_delta.m_backend.data._M_elems[0x12] = in_stack_fffffffffffffd48._40_4_;
  p_delta.m_backend.data._M_elems[0x13] = in_stack_fffffffffffffd48._44_4_;
  p_delta.m_backend.data._M_elems[0x14] = in_stack_fffffffffffffd48._48_4_;
  p_delta.m_backend.data._M_elems[0x15] = in_stack_fffffffffffffd48._52_4_;
  p_delta.m_backend.data._M_elems[0x16] = in_stack_fffffffffffffd48._56_4_;
  p_delta.m_backend.data._M_elems[0x17] = in_stack_fffffffffffffd48._60_4_;
  p_delta.m_backend.data._M_elems[0x18] = in_stack_fffffffffffffd48._64_4_;
  p_delta.m_backend.data._M_elems[0x19] = in_stack_fffffffffffffd48._68_4_;
  p_delta.m_backend.data._M_elems[0x1a] = in_stack_fffffffffffffd48._72_4_;
  p_delta.m_backend.data._M_elems[0x1b] = in_stack_fffffffffffffd48._76_4_;
  p_delta.m_backend.exp = in_stack_fffffffffffffd48._80_4_;
  p_delta.m_backend.neg = (bool)in_stack_fffffffffffffd48[0x54];
  p_delta.m_backend._117_3_ = in_stack_fffffffffffffd48._85_3_;
  p_delta.m_backend.fpclass = in_stack_fffffffffffffd48._88_4_;
  p_delta.m_backend.prec_elem = in_stack_fffffffffffffd48._92_4_;
  perturbMax((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffd50,this,pUVar2,pVVar1,pVVar3,&local_b0,p_delta,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<200U,_int,_void> *)&stack0xfffffffffffffd50)
  ;
  pVVar1 = this->theCoLbound;
  pUVar2 = this->theCoPvec;
  pVVar3 = this->theCoUbound;
  epsilon(&local_130,this);
  leavetol(&local_230,this);
  p_delta_00.m_backend.data._M_elems._8_8_ =
       ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thedesc.costat)->data;
  p_delta_00.m_backend.data._M_elems._0_8_ = &local_230;
  p_delta_00.m_backend.data._M_elems[4] = 0;
  p_delta_00.m_backend.data._M_elems[5] = 0;
  p_delta_00.m_backend.data._M_elems[6] = 1;
  p_delta_00.m_backend.data._M_elems[7] = 0;
  p_delta_00.m_backend.data._M_elems[8] = in_stack_fffffffffffffd48._0_4_;
  p_delta_00.m_backend.data._M_elems[9] = in_stack_fffffffffffffd48._4_4_;
  p_delta_00.m_backend.data._M_elems[10] = in_stack_fffffffffffffd48._8_4_;
  p_delta_00.m_backend.data._M_elems[0xb] = in_stack_fffffffffffffd48._12_4_;
  p_delta_00.m_backend.data._M_elems[0xc] = in_stack_fffffffffffffd48._16_4_;
  p_delta_00.m_backend.data._M_elems[0xd] = in_stack_fffffffffffffd48._20_4_;
  p_delta_00.m_backend.data._M_elems[0xe] = in_stack_fffffffffffffd48._24_4_;
  p_delta_00.m_backend.data._M_elems[0xf] = in_stack_fffffffffffffd48._28_4_;
  p_delta_00.m_backend.data._M_elems[0x10] = in_stack_fffffffffffffd48._32_4_;
  p_delta_00.m_backend.data._M_elems[0x11] = in_stack_fffffffffffffd48._36_4_;
  p_delta_00.m_backend.data._M_elems[0x12] = in_stack_fffffffffffffd48._40_4_;
  p_delta_00.m_backend.data._M_elems[0x13] = in_stack_fffffffffffffd48._44_4_;
  p_delta_00.m_backend.data._M_elems[0x14] = in_stack_fffffffffffffd48._48_4_;
  p_delta_00.m_backend.data._M_elems[0x15] = in_stack_fffffffffffffd48._52_4_;
  p_delta_00.m_backend.data._M_elems[0x16] = in_stack_fffffffffffffd48._56_4_;
  p_delta_00.m_backend.data._M_elems[0x17] = in_stack_fffffffffffffd48._60_4_;
  p_delta_00.m_backend.data._M_elems[0x18] = in_stack_fffffffffffffd48._64_4_;
  p_delta_00.m_backend.data._M_elems[0x19] = in_stack_fffffffffffffd48._68_4_;
  p_delta_00.m_backend.data._M_elems[0x1a] = in_stack_fffffffffffffd48._72_4_;
  p_delta_00.m_backend.data._M_elems[0x1b] = in_stack_fffffffffffffd48._76_4_;
  p_delta_00.m_backend.exp = in_stack_fffffffffffffd48._80_4_;
  p_delta_00.m_backend.neg = (bool)in_stack_fffffffffffffd48[0x54];
  p_delta_00.m_backend._117_3_ = in_stack_fffffffffffffd48._85_3_;
  p_delta_00.m_backend.fpclass = in_stack_fffffffffffffd48._88_4_;
  p_delta_00.m_backend.prec_elem = in_stack_fffffffffffffd48._92_4_;
  perturbMax((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&stack0xfffffffffffffd50,this,pUVar2,pVVar1,pVVar3,&local_130,p_delta_00,
             in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(this->theShift).m_backend,(cpp_dec_float<200U,_int,_void> *)&stack0xfffffffffffffd50)
  ;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&stack0xfffffffffffffd50,this);
  return;
}

Assistant:

void SPxSolverBase<R>::perturbMaxLeave(void)
{
   SPxOut::debug(this, "DSHIFT06 iteration= {} perturbing {}", this->iteration(), shift());
   pVec().delta().setup();
   coPvec().delta().setup();
   theShift += perturbMax(pVec(), lpBound(), upBound(), epsilon(), leavetol(),
                          this->desc().status(), 0, 1);
   theShift += perturbMax(coPvec(), lcBound(), ucBound(), epsilon(), leavetol(),
                          this->desc().coStatus(), 0, 1);
   SPxOut::debug(this, "\t->{}\n", shift());
}